

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O3

bool __thiscall
SimplexTimer::reportSimplexInnerClock
          (SimplexTimer *this,HighsTimerClock *simplex_timer_clock,double tolerance_percent_report_)

{
  bool bVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> simplex_clock_list;
  allocator_type local_121;
  double local_120;
  vector<int,_std::allocator<int>_> local_118;
  vector<int,_std::allocator<int>_> local_100;
  int local_e8 [50];
  
  local_120 = tolerance_percent_report_;
  memcpy(local_e8,&DAT_003d45d8,200);
  __l._M_len = 0x32;
  __l._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,__l,&local_121);
  std::vector<int,_std::allocator<int>_>::vector(&local_118,&local_100);
  bVar1 = reportSimplexClockList(this,"SimplexInner",&local_118,simplex_timer_clock,local_120);
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool reportSimplexInnerClock(const HighsTimerClock& simplex_timer_clock,
                               const double tolerance_percent_report_ = -1) {
    const std::vector<HighsInt> simplex_clock_list{
        initialiseSimplexLpBasisAndFactorClock,
        allocateSimplexArraysClock,
        initialiseSimplexCostBoundsClock,
        setNonbasicMoveClock,
        DevexIzClock,
        DseIzClock,
        ComputeDualClock,
        CorrectDualClock,
        ComputePrimalClock,
        CollectPrIfsClock,
        ComputePrIfsClock,
        ComputeDuIfsClock,
        ComputeDuObjClock,
        ComputePrObjClock,
        InvertClock,
        ReportRebuildClock,
        PermWtClock,
        ChuzcPrimalClock,
        ChuzcHyperInitialiselClock,
        ChuzcHyperBasicFeasibilityChangeClock,
        ChuzcHyperDualClock,
        ChuzcHyperClock,
        Chuzc0Clock,
        Chuzc1Clock,
        Chuzc2Clock,
        Chuzc3Clock,
        Chuzc4Clock,
        Chuzc5Clock,
        FtranClock,
        ChuzrDualClock,
        Chuzr1Clock,
        Chuzr2Clock,
        BtranClock,
        PriceClock,
        BtranBasicFeasibilityChangeClock,
        PriceBasicFeasibilityChangeClock,
        UpdateDualBasicFeasibilityChangeClock,
        FtranBfrtClock,
        FtranDseClock,
        BtranPseClock,
        BtranFullClock,
        PriceFullClock,
        DevexWtClock,
        DevexUpdateWeightClock,
        DseUpdateWeightClock,
        UpdatePrimalClock,
        UpdateDualClock,
        UpdatePivotsClock,
        UpdateFactorClock,
        UpdateMatrixClock};
    return reportSimplexClockList("SimplexInner", simplex_clock_list,
                                  simplex_timer_clock,
                                  tolerance_percent_report_);
  }